

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O2

bool DeleteElem(LinearList *L,int i)

{
  int iVar1;
  ulong uVar2;
  
  if ((-1 < i) && (iVar1 = L->Last, iVar1 != 0 && i <= iVar1)) {
    for (uVar2 = (ulong)(uint)i; (int)uVar2 < iVar1 + -1; uVar2 = uVar2 + 1) {
      L->data[uVar2] = L->data[uVar2 + 1];
      iVar1 = L->Last;
    }
    L->Last = iVar1 + -1;
    return true;
  }
  return false;
}

Assistant:

bool DeleteElem(LinearList *L,int i)  //删除表中第i个结点
{
    if(i<0 || i > L->Last || L->Last==0)
        return false;  //第i个结点不存在，删除失败
    else
    {
        int j;
        for(j = i; j < L->Last-1; j++)
            L->data[j] = L->data[j+1];  //前移
        L->Last--;  //表长-1
        return true;  //删除成功
    }
}